

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

int lws_bind_protocol(lws *wsi,lws_protocols *p,char *reason)

{
  lws_protocols *plVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  lws_protocols *plVar4;
  int n;
  
  plVar1 = (wsi->a).protocol;
  plVar4 = ((wsi->a).vhost)->protocols;
  if ((plVar1 != (lws_protocols *)0x0) && ((wsi->field_0x472 & 4) != 0)) {
    (*plVar1->callback)(wsi,(lws_callback_reasons)
                            wsi->role_ops->protocol_unbind_cb[(wsi->wsistate >> 0x1d & 1) != 0],
                        wsi->user_space,reason,0);
    wsi->field_0x472 = wsi->field_0x472 & 0xfb;
  }
  if ((wsi->field_0x46f & 8) == 0) {
    lws_realloc(wsi->user_space,0,"free");
    wsi->user_space = (void *)0x0;
  }
  lws_same_vh_protocol_remove(wsi);
  (wsi->a).protocol = p;
  if (p != (lws_protocols *)0x0) {
    iVar2 = lws_ensure_user_space(wsi);
    if (iVar2 != 0) {
      return 1;
    }
    if ((plVar4 < p) && (p < plVar4 + ((wsi->a).vhost)->count_protocols)) {
      lws_same_vh_protocol_insert(wsi,(int)((ulong)((long)p - (long)plVar4) >> 3) * -0x49249249);
    }
    else {
      iVar2 = ((wsi->a).vhost)->count_protocols;
      if (iVar2 != 0) {
        __s1 = p->name;
        n = 0;
        do {
          if (((__s1 != (char *)0x0) && (plVar4->name != (char *)0x0)) &&
             (iVar3 = strcmp(__s1,plVar4->name), iVar3 == 0)) {
            lws_same_vh_protocol_insert(wsi,n);
            goto LAB_001283b7;
          }
          plVar4 = plVar4 + 1;
          n = n + 1;
        } while (iVar2 != n);
      }
      _lws_log(1,"%s: %p is not in vhost \'%s\' protocols list\n","lws_bind_protocol",p,
               ((wsi->a).vhost)->name);
    }
LAB_001283b7:
    iVar2 = (*((wsi->a).protocol)->callback)
                      (wsi,(lws_callback_reasons)
                           wsi->role_ops->protocol_bind_cb[(wsi->wsistate >> 0x1d & 1) != 0],
                       wsi->user_space,(void *)0x0,0);
    if (iVar2 != 0) {
      return 1;
    }
    wsi->field_0x472 = wsi->field_0x472 | 4;
  }
  return 0;
}

Assistant:

int
lws_bind_protocol(struct lws *wsi, const struct lws_protocols *p,
		  const char *reason)
{
//	if (wsi->a.protocol == p)
//		return 0;
	const struct lws_protocols *vp = wsi->a.vhost->protocols, *vpo;

	if (wsi->a.protocol && wsi->protocol_bind_balance) {
		wsi->a.protocol->callback(wsi,
		       wsi->role_ops->protocol_unbind_cb[!!lwsi_role_server(wsi)],
					wsi->user_space, (void *)reason, 0);
		wsi->protocol_bind_balance = 0;
	}
	if (!wsi->user_space_externally_allocated)
		lws_free_set_NULL(wsi->user_space);

	lws_same_vh_protocol_remove(wsi);

	wsi->a.protocol = p;
	if (!p)
		return 0;

	if (lws_ensure_user_space(wsi))
		return 1;

	if (p > vp && p < &vp[wsi->a.vhost->count_protocols])
		lws_same_vh_protocol_insert(wsi, (int)(p - vp));
	else {
		int n = wsi->a.vhost->count_protocols;
		int hit = 0;

		vpo = vp;

		while (n--) {
			if (p->name && vp->name && !strcmp(p->name, vp->name)) {
				hit = 1;
				lws_same_vh_protocol_insert(wsi, (int)(vp - vpo));
				break;
			}
			vp++;
		}
		if (!hit)
			lwsl_err("%s: %p is not in vhost '%s' protocols list\n",
				 __func__, p, wsi->a.vhost->name);
	}

	if (wsi->a.protocol->callback(wsi, wsi->role_ops->protocol_bind_cb[
				    !!lwsi_role_server(wsi)],
				    wsi->user_space, NULL, 0))
		return 1;

	wsi->protocol_bind_balance = 1;

	return 0;
}